

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxgeometsc.hpp
# Opt level: O1

number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
computeScalingVec<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
          (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *__return_storage_ptr__,soplex *this,
          SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *vecset,vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  *coScaleval,
          vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          *scaleval,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *epsilon)

{
  double a;
  pointer pnVar1;
  fpclass_type fVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int iVar5;
  cpp_dec_float<200U,_int,_void> *pcVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  *pvVar10;
  undefined4 *puVar11;
  cpp_dec_float<200U,_int,_void> *pcVar12;
  uint *puVar13;
  cpp_dec_float<200U,_int,_void> *pcVar14;
  undefined4 *puVar15;
  pointer pnVar16;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar17;
  long lVar18;
  long *plVar19;
  long lVar20;
  long in_FS_OFFSET;
  byte bVar21;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  p;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_3;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_4;
  undefined1 local_458 [16];
  undefined1 local_448 [16];
  undefined1 local_438 [16];
  undefined1 local_428 [16];
  undefined1 local_418 [16];
  undefined1 local_408 [16];
  uint local_3f8 [3];
  undefined3 uStack_3eb;
  int iStack_3e8;
  bool bStack_3e4;
  undefined8 local_3e0;
  undefined1 local_3d8 [16];
  undefined1 local_3c8 [16];
  undefined1 local_3b8 [16];
  undefined1 local_3a8 [16];
  undefined1 local_398 [16];
  undefined1 local_388 [16];
  uint local_378 [3];
  undefined3 uStack_36b;
  int iStack_368;
  bool bStack_364;
  undefined8 local_360;
  soplex *local_350;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  *local_348;
  SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_340;
  undefined1 local_338 [32];
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [13];
  undefined3 uStack_2cb;
  int iStack_2c8;
  bool bStack_2c4;
  undefined8 local_2c0;
  undefined1 local_2b8 [32];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [13];
  undefined3 uStack_24b;
  int iStack_248;
  bool bStack_244;
  undefined8 local_240;
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [13];
  undefined3 uStack_1cb;
  int iStack_1c8;
  bool bStack_1c4;
  undefined8 local_1c0;
  cpp_dec_float<200U,_int,_void> local_1b0;
  cpp_dec_float<200U,_int,_void> local_130;
  undefined1 local_b0 [128];
  
  bVar21 = 0;
  (__return_storage_ptr__->m_backend).fpclass = cpp_dec_float_finite;
  (__return_storage_ptr__->m_backend).prec_elem = 0x1c;
  (__return_storage_ptr__->m_backend).data._M_elems[0] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[1] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[2] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[3] = 0;
  pcVar12 = &__return_storage_ptr__->m_backend;
  (pcVar12->data)._M_elems[4] = 0;
  (pcVar12->data)._M_elems[5] = 0;
  (pcVar12->data)._M_elems[6] = 0;
  (pcVar12->data)._M_elems[7] = 0;
  pcVar12 = &__return_storage_ptr__->m_backend;
  (pcVar12->data)._M_elems[8] = 0;
  (pcVar12->data)._M_elems[9] = 0;
  (pcVar12->data)._M_elems[10] = 0;
  (pcVar12->data)._M_elems[0xb] = 0;
  pcVar12 = &__return_storage_ptr__->m_backend;
  (pcVar12->data)._M_elems[0xc] = 0;
  (pcVar12->data)._M_elems[0xd] = 0;
  (pcVar12->data)._M_elems[0xe] = 0;
  (pcVar12->data)._M_elems[0xf] = 0;
  pcVar12 = &__return_storage_ptr__->m_backend;
  (pcVar12->data)._M_elems[0x10] = 0;
  (pcVar12->data)._M_elems[0x11] = 0;
  (pcVar12->data)._M_elems[0x12] = 0;
  (pcVar12->data)._M_elems[0x13] = 0;
  pcVar12 = &__return_storage_ptr__->m_backend;
  (pcVar12->data)._M_elems[0x14] = 0;
  (pcVar12->data)._M_elems[0x15] = 0;
  (pcVar12->data)._M_elems[0x16] = 0;
  (pcVar12->data)._M_elems[0x17] = 0;
  pcVar12 = &__return_storage_ptr__->m_backend;
  (pcVar12->data)._M_elems[0x18] = 0;
  (pcVar12->data)._M_elems[0x19] = 0;
  (pcVar12->data)._M_elems[0x1a] = 0;
  (pcVar12->data)._M_elems[0x1b] = 0;
  *(undefined8 *)((long)(__return_storage_ptr__->m_backend).data._M_elems + 0x6d) = 0;
  local_348 = coScaleval;
  local_340 = vecset;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)__return_storage_ptr__,0.0);
  if (0 < *(int *)(this + 0x38)) {
    a = *(double *)(in_FS_OFFSET + -8);
    lVar9 = 0;
    local_350 = this;
    do {
      plVar19 = (long *)((long)*(int *)(*(long *)(local_350 + 0x28) + 4 + lVar9 * 8) * 0x28 +
                        *(long *)(local_350 + 0x20));
      local_240._0_4_ = cpp_dec_float_finite;
      local_240._4_4_ = 0x1c;
      local_2b8._0_16_ = (undefined1  [16])0x0;
      local_2b8._16_16_ = (undefined1  [16])0x0;
      local_298 = (undefined1  [16])0x0;
      local_288 = (undefined1  [16])0x0;
      local_278 = (undefined1  [16])0x0;
      local_268 = (undefined1  [16])0x0;
      local_258 = SUB1613((undefined1  [16])0x0,0);
      uStack_24b = 0;
      iStack_248 = 0;
      bStack_244 = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)local_2b8,0.0);
      ::soplex::infinity::__tls_init();
      local_2c0._0_4_ = cpp_dec_float_finite;
      local_2c0._4_4_ = 0x1c;
      local_338._0_16_ = (undefined1  [16])0x0;
      local_338._16_16_ = (undefined1  [16])0x0;
      local_318 = (undefined1  [16])0x0;
      local_308 = (undefined1  [16])0x0;
      local_2f8 = (undefined1  [16])0x0;
      local_2e8 = (undefined1  [16])0x0;
      local_2d8 = SUB1613((undefined1  [16])0x0,0);
      uStack_2cb = 0;
      iStack_2c8 = 0;
      bStack_2c4 = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)local_338,a);
      if (0 < *(int *)((long)plVar19 + 0xc)) {
        lVar20 = 0;
        lVar18 = 0;
        do {
          lVar8 = *plVar19;
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)(lVar8 + lVar20);
          pcVar14 = (cpp_dec_float<200U,_int,_void> *)
                    ((local_340->
                     super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     )._vptr_ClassArray + (ulong)*(uint *)(lVar8 + 0x80 + lVar20) * 0x10);
          local_1c0._0_4_ = cpp_dec_float_finite;
          local_1c0._4_4_ = 0x1c;
          local_238 = (undefined1  [16])0x0;
          local_228 = (undefined1  [16])0x0;
          local_218 = (undefined1  [16])0x0;
          local_208 = (undefined1  [16])0x0;
          local_1f8 = (undefined1  [16])0x0;
          local_1e8 = (undefined1  [16])0x0;
          local_1d8 = SUB1613((undefined1  [16])0x0,0);
          uStack_1cb = 0;
          iStack_1c8 = 0;
          bStack_1c4 = false;
          pcVar6 = pcVar12;
          if (((cpp_dec_float<200U,_int,_void> *)local_238 != pcVar14) &&
             (pcVar6 = pcVar14, pcVar12 != (cpp_dec_float<200U,_int,_void> *)local_238)) {
            pcVar14 = (cpp_dec_float<200U,_int,_void> *)local_238;
            for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
              (pcVar14->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar21 * -8 + 4);
              pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar21 * -8 + 4);
            }
            iStack_1c8 = *(int *)(lVar8 + 0x70 + lVar20);
            bStack_1c4 = *(bool *)(lVar8 + 0x74 + lVar20);
            local_1c0 = *(undefined8 *)(lVar8 + 0x78 + lVar20);
          }
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                    ((cpp_dec_float<200U,_int,_void> *)local_238,pcVar6);
          local_3e0._0_4_ = cpp_dec_float_finite;
          local_3e0._4_4_ = 0x1c;
          iStack_3e8 = 0;
          bStack_3e4 = false;
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_238;
          puVar13 = (uint *)local_458;
          for (lVar8 = 0x1c; uVar3 = local_1c0, iVar5 = iStack_1c8, lVar8 != 0; lVar8 = lVar8 + -1)
          {
            *puVar13 = (pcVar12->data)._M_elems[0];
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar21 * -8 + 4);
            puVar13 = puVar13 + (ulong)bVar21 * -2 + 1;
          }
          iStack_3e8 = iStack_1c8;
          bStack_3e4 = bStack_1c4;
          fVar2 = (fpclass_type)local_1c0;
          local_3e0._0_4_ = (fpclass_type)local_1c0;
          local_3e0._4_4_ = local_1c0._4_4_;
          if ((bStack_1c4 == true) && (local_458._0_4_ != 0 || fVar2 != cpp_dec_float_finite)) {
            bStack_3e4 = false;
          }
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_238;
          puVar13 = (uint *)local_3d8;
          for (lVar8 = 0x1c; uVar4 = local_1c0, lVar8 != 0; lVar8 = lVar8 + -1) {
            *puVar13 = (pcVar12->data)._M_elems[0];
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar21 * -8 + 4);
            puVar13 = puVar13 + (ulong)bVar21 * -2 + 1;
          }
          pvVar10 = scaleval;
          puVar11 = (undefined4 *)local_b0;
          for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
            *puVar11 = *(undefined4 *)
                        &(pvVar10->
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         )._M_impl.super__Vector_impl_data._M_start;
            pvVar10 = (vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       *)((long)pvVar10 + (ulong)bVar21 * -8 + 4);
            puVar11 = puVar11 + (ulong)bVar21 * -2 + 1;
          }
          local_b0._112_4_ =
               *(undefined4 *)
                &scaleval[4].
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_b0[0x74] =
               *(undefined1 *)
                ((long)&scaleval[4].
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 4);
          local_b0._120_8_ =
               scaleval[5].
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          iStack_368 = iVar5;
          bStack_364 = bStack_3e4;
          local_1c0._0_4_ = (fpclass_type)uVar3;
          local_1c0._4_4_ = SUB84(uVar3,4);
          local_360._0_4_ = (fpclass_type)local_1c0;
          local_360._4_4_ = local_1c0._4_4_;
          if ((bStack_3e4 == true) && (local_3d8._0_4_ != 0 || fVar2 != cpp_dec_float_finite)) {
            bStack_364 = false;
          }
          local_1c0 = uVar4;
          if (((int)local_b0._120_8_ == 2 || fVar2 == cpp_dec_float_NaN) ||
             (iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                ((cpp_dec_float<200U,_int,_void> *)local_3d8,
                                 (cpp_dec_float<200U,_int,_void> *)local_b0), 0 < iVar5)) {
            if (((fpclass_type)local_3e0 != cpp_dec_float_NaN) &&
               (((fpclass_type)local_240 != cpp_dec_float_NaN &&
                (iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                   ((cpp_dec_float<200U,_int,_void> *)local_458,
                                    (cpp_dec_float<200U,_int,_void> *)local_2b8), 0 < iVar5)))) {
              puVar11 = (undefined4 *)local_458;
              puVar15 = (undefined4 *)local_2b8;
              for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
                *puVar15 = *puVar11;
                puVar11 = puVar11 + (ulong)bVar21 * -2 + 1;
                puVar15 = puVar15 + (ulong)bVar21 * -2 + 1;
              }
              iStack_248 = iStack_3e8;
              bStack_244 = bStack_3e4;
              local_240._0_4_ = (fpclass_type)local_3e0;
              local_240._4_4_ = local_3e0._4_4_;
            }
            if ((((fpclass_type)local_3e0 != cpp_dec_float_NaN) &&
                ((fpclass_type)local_2c0 != cpp_dec_float_NaN)) &&
               (iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                  ((cpp_dec_float<200U,_int,_void> *)local_458,
                                   (cpp_dec_float<200U,_int,_void> *)local_338), iVar5 < 0)) {
              puVar11 = (undefined4 *)local_458;
              puVar15 = (undefined4 *)local_338;
              for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
                *puVar15 = *puVar11;
                puVar11 = puVar11 + (ulong)bVar21 * -2 + 1;
                puVar15 = puVar15 + (ulong)bVar21 * -2 + 1;
              }
              iStack_2c8 = iStack_3e8;
              bStack_2c4 = bStack_3e4;
              local_2c0._0_4_ = (fpclass_type)local_3e0;
              local_2c0._4_4_ = local_3e0._4_4_;
            }
          }
          lVar18 = lVar18 + 1;
          lVar20 = lVar20 + 0x84;
        } while (lVar18 < *(int *)((long)plVar19 + 0xc));
      }
      ::soplex::infinity::__tls_init();
      local_3e0._0_4_ = cpp_dec_float_finite;
      local_3e0._4_4_ = 0x1c;
      local_458 = (undefined1  [16])0x0;
      local_448 = (undefined1  [16])0x0;
      local_438 = (undefined1  [16])0x0;
      local_428 = (undefined1  [16])0x0;
      local_418 = (undefined1  [16])0x0;
      local_408 = (undefined1  [16])0x0;
      local_3f8[0] = 0;
      local_3f8[1] = 0;
      stack0xfffffffffffffc10 = 0;
      uStack_3eb = 0;
      iStack_3e8 = 0;
      bStack_3e4 = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)local_458,a);
      if ((((fpclass_type)local_2c0 == cpp_dec_float_NaN) ||
          ((fpclass_type)local_3e0 == cpp_dec_float_NaN)) ||
         (iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            ((cpp_dec_float<200U,_int,_void> *)local_338,
                             (cpp_dec_float<200U,_int,_void> *)local_458), iVar5 != 0)) {
        if ((fpclass_type)local_240 != cpp_dec_float_NaN) {
          local_360._0_4_ = cpp_dec_float_finite;
          local_360._4_4_ = 0x1c;
          local_3d8 = ZEXT816(0);
          local_3c8 = ZEXT816(0);
          local_3b8 = ZEXT816(0);
          local_3a8 = ZEXT816(0);
          local_398 = ZEXT816(0);
          local_388 = ZEXT816(0);
          local_378[0] = 0;
          local_378[1] = 0;
          stack0xfffffffffffffc90 = 0;
          uStack_36b = 0;
          iStack_368 = 0;
          bStack_364 = false;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)local_3d8,0.0);
          iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            ((cpp_dec_float<200U,_int,_void> *)local_2b8,
                             (cpp_dec_float<200U,_int,_void> *)local_3d8);
          if (iVar5 == 0) goto LAB_0014a7d1;
        }
      }
      else {
LAB_0014a7d1:
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)local_338,1.0);
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)local_2b8,1.0);
      }
      local_1b0.fpclass = cpp_dec_float_finite;
      local_1b0.prec_elem = 0x1c;
      local_1b0.neg = false;
      local_1b0.exp = 0;
      puVar13 = (uint *)local_338;
      pcVar12 = &local_1b0;
      for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
        (pcVar12->data)._M_elems[0] = *puVar13;
        puVar13 = puVar13 + (ulong)bVar21 * -2 + 1;
        pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar21 * -8 + 4);
      }
      local_1b0.exp = iStack_2c8;
      local_1b0.neg = bStack_2c4;
      local_1b0.fpclass = (fpclass_type)local_2c0;
      local_1b0.prec_elem = local_2c0._4_4_;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                (&local_1b0,(cpp_dec_float<200U,_int,_void> *)local_2b8);
      local_130.fpclass = cpp_dec_float_finite;
      local_130.prec_elem = 0x1c;
      local_130.exp = 0;
      local_130.neg = false;
      pcVar12 = &local_1b0;
      pcVar6 = &local_130;
      for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
        (pcVar6->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
        pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar21 * -8 + 4);
        pcVar6 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar6 + (ulong)bVar21 * -8 + 4);
      }
      local_130.exp = local_1b0.exp;
      local_130.neg = local_1b0.neg;
      local_130.fpclass = local_1b0.fpclass;
      local_130.prec_elem = local_1b0.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::calculate_sqrt(&local_130);
      local_3e0._0_4_ = cpp_dec_float_finite;
      local_3e0._4_4_ = 0x1c;
      local_458 = ZEXT816(0);
      local_448 = ZEXT816(0);
      local_438 = ZEXT816(0);
      local_428 = ZEXT816(0);
      local_418 = ZEXT816(0);
      local_408 = ZEXT816(0);
      local_3f8[0] = 0;
      local_3f8[1] = 0;
      stack0xfffffffffffffc10 = 0;
      uStack_3eb = 0;
      iStack_3e8 = 0;
      bStack_3e4 = false;
      local_360._0_4_ = cpp_dec_float_finite;
      local_360._4_4_ = 0x1c;
      local_3d8 = ZEXT816(0);
      local_3c8 = ZEXT816(0);
      local_3b8 = ZEXT816(0);
      local_3a8 = ZEXT816(0);
      local_398 = ZEXT816(0);
      local_388 = ZEXT816(0);
      local_378[0] = 0;
      local_378[1] = 0;
      stack0xfffffffffffffc90 = 0;
      uStack_36b = 0;
      iStack_368 = 0;
      bStack_364 = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)local_3d8,1.0);
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                ((cpp_dec_float<200U,_int,_void> *)local_458,
                 (cpp_dec_float<200U,_int,_void> *)local_3d8,&local_130);
      pnVar1 = (local_348->
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_458;
      pnVar16 = pnVar1 + lVar9;
      for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
        (pnVar16->m_backend).data._M_elems[0] = (pcVar12->data)._M_elems[0];
        pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar21 * -8 + 4);
        pnVar16 = (pointer)((long)pnVar16 + ((ulong)bVar21 * -2 + 1) * 4);
      }
      pnVar1[lVar9].m_backend.exp = iStack_3e8;
      pnVar1[lVar9].m_backend.neg = bStack_3e4;
      pnVar1[lVar9].m_backend.fpclass = (fpclass_type)local_3e0;
      pnVar1[lVar9].m_backend.prec_elem = local_3e0._4_4_;
      local_360._0_4_ = cpp_dec_float_finite;
      local_360._4_4_ = 0x1c;
      local_3d8 = (undefined1  [16])0x0;
      local_3c8 = (undefined1  [16])0x0;
      local_3b8 = (undefined1  [16])0x0;
      local_3a8 = (undefined1  [16])0x0;
      local_398 = (undefined1  [16])0x0;
      local_388 = (undefined1  [16])0x0;
      local_378[0] = 0;
      local_378[1] = 0;
      stack0xfffffffffffffc90 = 0;
      uStack_36b = 0;
      iStack_368 = 0;
      bStack_364 = false;
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                ((cpp_dec_float<200U,_int,_void> *)local_3d8,
                 (cpp_dec_float<200U,_int,_void> *)local_2b8,
                 (cpp_dec_float<200U,_int,_void> *)local_338);
      if ((((fpclass_type)local_360 != cpp_dec_float_NaN) &&
          ((__return_storage_ptr__->m_backend).fpclass != cpp_dec_float_NaN)) &&
         (iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            ((cpp_dec_float<200U,_int,_void> *)local_3d8,
                             &__return_storage_ptr__->m_backend), 0 < iVar5)) {
        puVar13 = (uint *)local_3d8;
        pnVar17 = __return_storage_ptr__;
        for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
          (pnVar17->m_backend).data._M_elems[0] = *puVar13;
          puVar13 = puVar13 + (ulong)bVar21 * -2 + 1;
          pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar17 + ((ulong)bVar21 * -2 + 1) * 4);
        }
        (__return_storage_ptr__->m_backend).exp = iStack_368;
        (__return_storage_ptr__->m_backend).neg = bStack_364;
        (__return_storage_ptr__->m_backend).fpclass = (fpclass_type)local_360;
        (__return_storage_ptr__->m_backend).prec_elem = local_360._4_4_;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < *(int *)(local_350 + 0x38));
  }
  return __return_storage_ptr__;
}

Assistant:

static R computeScalingVec(
   const SVSetBase<R>*   vecset, const std::vector<R>& coScaleval,
   std::vector<R>&       scaleval, R epsilon)
{
   R pmax = 0.0;

   assert(scaleval.size() == unsigned(vecset->num()));

   for(int i = 0; i < vecset->num(); ++i)
   {
      const SVectorBase<R>& vec = (*vecset)[i];

      R maxi = 0.0;
      R mini = R(infinity);

      for(int j = 0; j < vec.size(); ++j)
      {
         const R x = spxAbs(vec.value(j) * coScaleval[unsigned(vec.index(j))]);

         if(!isZero(x, epsilon))
         {
            if(x > maxi)
               maxi = x;

            if(x < mini)
               mini = x;
         }
      }

      // empty rows/cols are possible
      if(mini == R(infinity) || maxi == 0.0)
      {
         mini = 1.0;
         maxi = 1.0;
      }

      assert(mini < R(infinity));
      assert(maxi > 0.0);

      scaleval[unsigned(i)] = 1.0 / spxSqrt(mini * maxi);

      const R p = maxi / mini;

      if(p > pmax)
         pmax = p;
   }

   return pmax;
}